

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx512::create_pipeline
          (ConvolutionDepthWise_x86_avx512 *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  long *plVar6;
  ulong uVar7;
  int _w;
  Layer *pLVar8;
  byte *in_RSI;
  Mat *in_RDI;
  Mat weight_data_r2_2;
  Mat weight_data_r2_1;
  Mat weight_data_r2;
  int elempack;
  int channels;
  int maxk;
  Option *in_stack_00000550;
  ConvolutionDepthWise_x86_avx512 *in_stack_00000558;
  Option *in_stack_fffffffffffffd28;
  int *piVar9;
  int in_stack_fffffffffffffd34;
  Mat *in_stack_fffffffffffffd38;
  undefined8 *puVar10;
  Mat *in_stack_fffffffffffffd40;
  Mat *pMVar11;
  undefined4 in_stack_fffffffffffffd78;
  int in_stack_fffffffffffffd7c;
  int in_stack_fffffffffffffd80;
  Option *in_stack_fffffffffffffd90;
  ConvolutionDepthWise_x86_avx512 *in_stack_fffffffffffffd98;
  Option *in_stack_fffffffffffffdb0;
  Mat *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  void *local_228;
  int *local_220;
  undefined8 local_218;
  undefined4 local_210;
  long *local_208;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined8 local_1e8;
  void *local_1d0;
  int *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  long *local_1b0;
  undefined4 local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined8 local_190;
  int local_184;
  int local_180;
  int local_17c;
  byte *local_178;
  int local_164;
  void **local_160;
  void **local_150;
  undefined8 *local_140;
  int local_130;
  undefined4 local_12c;
  undefined8 *local_128;
  int *local_120;
  int *local_118;
  int local_110;
  undefined4 local_10c;
  undefined8 *local_108;
  int *local_100;
  int *local_f8;
  int local_f0;
  undefined4 local_ec;
  int *local_e8;
  int local_e0;
  undefined4 local_dc;
  int *local_d8;
  int local_c0;
  undefined4 local_bc;
  undefined8 *local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_80;
  undefined4 local_7c;
  void **local_78;
  int local_70;
  undefined4 local_6c;
  undefined8 *local_68;
  int local_60;
  undefined4 local_5c;
  undefined8 *local_58;
  void *local_50;
  void *local_48;
  void *local_10;
  void *local_8;
  
  if (*(int *)((long)&in_RDI[4].cstep + *(long *)((long)in_RDI->data + -0x18)) == 0) {
    local_178 = in_RSI;
    pLVar8 = create_activation_layer
                       (in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8,
                        in_stack_fffffffffffffdb0);
    in_RDI->refcount = (int *)pLVar8;
    if (((local_178[0x1e] & 1) == 0) ||
       (*(long *)((long)&in_RDI[5].elemsize + *(long *)((long)in_RDI->data + -0x18)) != 1)) {
      local_17c = *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) *
                  *(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18));
      uVar7 = (long)*(int *)((long)&in_RDI[3].w + *(long *)((long)in_RDI->data + -0x18)) /
              (long)*(int *)((long)&in_RDI[3].h + *(long *)((long)in_RDI->data + -0x18));
      _w = (int)((long)((ulong)(uint)((int)uVar7 >> 0x1f) << 0x20 | uVar7 & 0xffffffff) /
                (long)local_17c);
      local_180 = (_w / (*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)) /
                        *(int *)((long)&in_RDI[3].h + *(long *)((long)in_RDI->data + -0x18)))) *
                  *(int *)((long)&in_RDI[3].h + *(long *)((long)in_RDI->data + -0x18));
      if ((local_180 == *(int *)((long)&in_RDI[3].h + *(long *)((long)in_RDI->data + -0x18))) &&
         (*(int *)((long)&in_RDI[3].h + *(long *)((long)in_RDI->data + -0x18)) ==
          *(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18)))) {
        local_184 = 1;
        if ((local_178[0x27] & 1) != 0) {
          if (local_180 % 0x10 == 0) {
            local_184 = 0x10;
            in_stack_fffffffffffffd80 = local_184;
          }
          else if (local_180 % 8 == 0) {
            in_stack_fffffffffffffd7c = 8;
            in_stack_fffffffffffffd80 = in_stack_fffffffffffffd7c;
            local_184 = in_stack_fffffffffffffd7c;
          }
          else {
            in_stack_fffffffffffffd7c = 1;
            in_stack_fffffffffffffd80 = in_stack_fffffffffffffd7c;
            local_184 = in_stack_fffffffffffffd7c;
            if (local_180 % 4 == 0) {
              in_stack_fffffffffffffd7c = 4;
              in_stack_fffffffffffffd80 = in_stack_fffffffffffffd7c;
              local_184 = in_stack_fffffffffffffd7c;
            }
          }
        }
        if (local_184 == 0x10) {
          Mat::reshape(in_RDI,_w,in_stack_fffffffffffffd80,
                       (Allocator *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          convert_packing(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
          local_160 = &local_1d0;
          local_78 = local_160;
          if (local_1c8 != (int *)0x0) {
            local_7c = 0xffffffff;
            LOCK();
            local_80 = *local_1c8;
            *local_1c8 = *local_1c8 + -1;
            UNLOCK();
            if (local_80 == 1) {
              if (local_1b0 == (long *)0x0) {
                if (local_1d0 != (void *)0x0) {
                  free(local_1d0);
                }
              }
              else {
                (**(code **)(*local_1b0 + 0x18))(local_1b0,local_1d0);
              }
            }
          }
          local_1d0 = (void *)0x0;
          local_1c0 = 0;
          local_1b8 = 0;
          local_1a8 = 0;
          local_1a4 = 0;
          local_1a0 = 0;
          local_19c = 0;
          local_198 = 0;
          local_190 = 0;
          local_1c8 = (int *)0x0;
        }
        if (local_184 == 8) {
          Mat::reshape(in_RDI,_w,in_stack_fffffffffffffd80,
                       (Allocator *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          convert_packing(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                          in_stack_fffffffffffffd34,in_stack_fffffffffffffd28);
          local_150 = &local_228;
          local_98 = local_150;
          if (local_220 != (int *)0x0) {
            local_9c = 0xffffffff;
            LOCK();
            local_a0 = *local_220;
            *local_220 = *local_220 + -1;
            UNLOCK();
            if (local_a0 == 1) {
              if (local_208 == (long *)0x0) {
                if (local_228 != (void *)0x0) {
                  free(local_228);
                }
              }
              else {
                (**(code **)(*local_208 + 0x18))(local_208,local_228);
              }
            }
          }
          local_228 = (void *)0x0;
          local_218 = 0;
          local_210 = 0;
          local_200 = 0;
          local_1fc = 0;
          local_1f8 = 0;
          local_1f4 = 0;
          local_1f0 = 0;
          local_1e8 = 0;
          local_220 = (int *)0x0;
        }
        if (local_184 == 4) {
          pMVar11 = (Mat *)&stack0xfffffffffffffd90;
          Mat::reshape(in_RDI,_w,in_stack_fffffffffffffd80,
                       (Allocator *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
          convert_packing(pMVar11,in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                          in_stack_fffffffffffffd28);
          puVar10 = (undefined8 *)&stack0xfffffffffffffd90;
          local_140 = puVar10;
          local_b8 = puVar10;
          if (in_stack_fffffffffffffd98 != (ConvolutionDepthWise_x86_avx512 *)0x0) {
            local_bc = 0xffffffff;
            LOCK();
            local_c0 = *(int *)&in_stack_fffffffffffffd98->_vptr_ConvolutionDepthWise_x86_avx512;
            *(int *)&in_stack_fffffffffffffd98->_vptr_ConvolutionDepthWise_x86_avx512 =
                 *(int *)&in_stack_fffffffffffffd98->_vptr_ConvolutionDepthWise_x86_avx512 + -1;
            UNLOCK();
            if (local_c0 == 1) {
              if (in_stack_fffffffffffffdb0 == (Option *)0x0) {
                if (in_stack_fffffffffffffd90 != (Option *)0x0) {
                  free(in_stack_fffffffffffffd90);
                }
              }
              else {
                (**(code **)(*(long *)in_stack_fffffffffffffdb0 + 0x18))
                          (in_stack_fffffffffffffdb0,in_stack_fffffffffffffd90);
              }
            }
          }
          *puVar10 = 0;
          puVar10[2] = 0;
          *(undefined4 *)(puVar10 + 3) = 0;
          *(undefined4 *)(puVar10 + 5) = 0;
          *(undefined4 *)((long)puVar10 + 0x2c) = 0;
          *(undefined4 *)(puVar10 + 6) = 0;
          *(undefined4 *)((long)puVar10 + 0x34) = 0;
          *(undefined4 *)(puVar10 + 7) = 0;
          puVar10[8] = 0;
          puVar10[1] = 0;
        }
        if (local_184 == 1) {
          if ((((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) == 3)
               && (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18)) == 3)) &&
              (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1)) &&
             (((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18)) == 1 &&
               (*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
               )) && (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18)) ==
                      1)))) {
            lVar1 = *(long *)((long)in_RDI->data + -0x18);
            local_108 = (undefined8 *)((long)&in_RDI[5].data + lVar1);
            piVar9 = &in_RDI->dims;
            local_100 = piVar9;
            local_f8 = piVar9;
            if (piVar9 != (int *)local_108) {
              if (*(long *)((long)&in_RDI[5].refcount + lVar1) != 0) {
                piVar2 = *(int **)((long)&in_RDI[5].refcount + lVar1);
                local_10c = 1;
                LOCK();
                local_110 = *piVar2;
                *piVar2 = *piVar2 + 1;
                UNLOCK();
              }
              lVar3._0_4_ = in_RDI->h;
              lVar3._4_4_ = in_RDI->d;
              pMVar11 = in_RDI;
              local_e8 = piVar9;
              if (lVar3 != 0) {
                piVar2 = *(int **)&in_RDI->h;
                local_ec = 0xffffffff;
                LOCK();
                local_f0 = *piVar2;
                *piVar2 = *piVar2 + -1;
                UNLOCK();
                if (local_f0 == 1) {
                  if (in_RDI[1].data == (void *)0x0) {
                    local_8 = *(void **)piVar9;
                    if (local_8 != (void *)0x0) {
                      free(local_8);
                    }
                  }
                  else {
                    uVar4._0_4_ = in_RDI->dims;
                    uVar4._4_4_ = in_RDI->w;
                    (**(code **)(*in_RDI[1].data + 0x18))(in_RDI[1].data,uVar4);
                  }
                }
              }
              in_RDI->dims = 0;
              in_RDI->w = 0;
              *(undefined8 *)&in_RDI->c = 0;
              *(undefined4 *)&in_RDI->cstep = 0;
              *(undefined4 *)&in_RDI[1].refcount = 0;
              *(undefined4 *)((long)&in_RDI[1].refcount + 4) = 0;
              *(undefined4 *)&in_RDI[1].elemsize = 0;
              *(undefined4 *)((long)&in_RDI[1].elemsize + 4) = 0;
              in_RDI[1].elempack = 0;
              in_RDI[1].allocator = (Allocator *)0x0;
              in_RDI->h = 0;
              in_RDI->d = 0;
              *(undefined8 *)piVar9 = *local_108;
              *(undefined8 *)(piVar9 + 2) = local_108[1];
              *(undefined8 *)(piVar9 + 4) = local_108[2];
              piVar9[6] = *(undefined4 *)(local_108 + 3);
              *(undefined8 *)(piVar9 + 8) = local_108[4];
              piVar9[10] = *(undefined4 *)(local_108 + 5);
              piVar9[0xb] = *(undefined4 *)((long)local_108 + 0x2c);
              piVar9[0xc] = *(undefined4 *)(local_108 + 6);
              piVar9[0xd] = *(undefined4 *)((long)local_108 + 0x34);
              piVar9[0xe] = *(undefined4 *)(local_108 + 7);
              *(undefined8 *)(piVar9 + 0x10) = local_108[8];
              in_RDI = pMVar11;
              local_f8 = piVar9;
            }
          }
          else if (((*(int *)((long)&in_RDI[2].cstep + *(long *)((long)in_RDI->data + -0x18) + 4) ==
                     3) && (*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18))
                            == 3)) &&
                  ((*(int *)((long)&in_RDI[3].data + *(long *)((long)in_RDI->data + -0x18) + 4) == 1
                   && (((*(int *)((long)&in_RDI[3].refcount + *(long *)((long)in_RDI->data + -0x18))
                         == 1 && (*(int *)((long)&in_RDI[3].refcount +
                                          *(long *)((long)in_RDI->data + -0x18) + 4) == 2)) &&
                       (*(int *)((long)&in_RDI[3].elemsize + *(long *)((long)in_RDI->data + -0x18))
                        == 2)))))) {
            lVar1 = *(long *)((long)in_RDI->data + -0x18);
            local_128 = (undefined8 *)((long)&in_RDI[5].data + lVar1);
            local_120 = &in_RDI->dims;
            local_118 = local_120;
            if (local_120 != (int *)local_128) {
              if (*(long *)((long)&in_RDI[5].refcount + lVar1) != 0) {
                piVar9 = *(int **)((long)&in_RDI[5].refcount + lVar1);
                local_12c = 1;
                LOCK();
                local_130 = *piVar9;
                *piVar9 = *piVar9 + 1;
                UNLOCK();
              }
              lVar1._0_4_ = in_RDI->h;
              lVar1._4_4_ = in_RDI->d;
              pMVar11 = in_RDI;
              local_d8 = local_120;
              if (lVar1 != 0) {
                piVar9 = *(int **)&in_RDI->h;
                local_dc = 0xffffffff;
                LOCK();
                local_e0 = *piVar9;
                *piVar9 = *piVar9 + -1;
                UNLOCK();
                if (local_e0 == 1) {
                  if (in_RDI[1].data == (void *)0x0) {
                    local_10 = *(void **)local_120;
                    if (local_10 != (void *)0x0) {
                      free(local_10);
                    }
                  }
                  else {
                    uVar5._0_4_ = in_RDI->dims;
                    uVar5._4_4_ = in_RDI->w;
                    (**(code **)(*in_RDI[1].data + 0x18))(in_RDI[1].data,uVar5);
                  }
                }
              }
              in_RDI->dims = 0;
              in_RDI->w = 0;
              *(undefined8 *)&in_RDI->c = 0;
              *(undefined4 *)&in_RDI->cstep = 0;
              *(undefined4 *)&in_RDI[1].refcount = 0;
              *(undefined4 *)((long)&in_RDI[1].refcount + 4) = 0;
              *(undefined4 *)&in_RDI[1].elemsize = 0;
              *(undefined4 *)((long)&in_RDI[1].elemsize + 4) = 0;
              in_RDI[1].elempack = 0;
              in_RDI[1].allocator = (Allocator *)0x0;
              in_RDI->h = 0;
              in_RDI->d = 0;
              uVar5 = *local_128;
              in_RDI->dims = (int)uVar5;
              in_RDI->w = (int)((ulong)uVar5 >> 0x20);
              uVar5 = local_128[1];
              in_RDI->h = (int)uVar5;
              in_RDI->d = (int)((ulong)uVar5 >> 0x20);
              *(undefined8 *)&in_RDI->c = local_128[2];
              *(undefined4 *)&in_RDI->cstep = *(undefined4 *)(local_128 + 3);
              in_RDI[1].data = (void *)local_128[4];
              *(undefined4 *)&in_RDI[1].refcount = *(undefined4 *)(local_128 + 5);
              *(undefined4 *)((long)&in_RDI[1].refcount + 4) =
                   *(undefined4 *)((long)local_128 + 0x2c);
              *(undefined4 *)&in_RDI[1].elemsize = *(undefined4 *)(local_128 + 6);
              *(undefined4 *)((long)&in_RDI[1].elemsize + 4) =
                   *(undefined4 *)((long)local_128 + 0x34);
              in_RDI[1].elempack = *(int *)(local_128 + 7);
              in_RDI[1].allocator = (Allocator *)local_128[8];
              in_RDI = pMVar11;
            }
          }
          else {
            create_group_ops(in_stack_00000558,in_stack_00000550);
          }
        }
        if ((*local_178 & 1) != 0) {
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          puVar10 = (undefined8 *)((long)&in_RDI[5].data + lVar1);
          if (*(long *)((long)&in_RDI[5].refcount + lVar1) != 0) {
            piVar9 = *(int **)((long)&in_RDI[5].refcount + lVar1);
            local_5c = 0xffffffff;
            LOCK();
            local_60 = *piVar9;
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (local_60 == 1) {
              local_58 = puVar10;
              if (*(long *)((long)&in_RDI[5].allocator + lVar1) == 0) {
                local_50 = (void *)*puVar10;
                if (local_50 != (void *)0x0) {
                  free(local_50);
                }
              }
              else {
                plVar6 = *(long **)((long)&in_RDI[5].allocator + lVar1);
                (**(code **)(*plVar6 + 0x18))(plVar6,*puVar10);
              }
            }
          }
          *puVar10 = 0;
          *(undefined8 *)((long)&in_RDI[5].elemsize + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].elempack + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].dims + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].w + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].h + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].d + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].c + lVar1) = 0;
          *(undefined8 *)((long)&in_RDI[5].cstep + lVar1) = 0;
          *(undefined8 *)((long)&in_RDI[5].refcount + lVar1) = 0;
        }
        local_164 = 0;
      }
      else {
        create_group_ops(in_stack_00000558,in_stack_00000550);
        if ((*local_178 & 1) != 0) {
          lVar1 = *(long *)((long)in_RDI->data + -0x18);
          puVar10 = (undefined8 *)((long)&in_RDI[5].data + lVar1);
          if (*(long *)((long)&in_RDI[5].refcount + lVar1) != 0) {
            piVar9 = *(int **)((long)&in_RDI[5].refcount + lVar1);
            local_6c = 0xffffffff;
            LOCK();
            local_70 = *piVar9;
            *piVar9 = *piVar9 + -1;
            UNLOCK();
            if (local_70 == 1) {
              local_68 = puVar10;
              if (*(long *)((long)&in_RDI[5].allocator + lVar1) == 0) {
                local_48 = (void *)*puVar10;
                if (local_48 != (void *)0x0) {
                  free(local_48);
                }
              }
              else {
                plVar6 = *(long **)((long)&in_RDI[5].allocator + lVar1);
                (**(code **)(*plVar6 + 0x18))(plVar6,*puVar10);
              }
            }
          }
          *puVar10 = 0;
          *(undefined8 *)((long)&in_RDI[5].elemsize + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].elempack + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].dims + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].w + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].h + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].d + lVar1) = 0;
          *(undefined4 *)((long)&in_RDI[5].c + lVar1) = 0;
          *(undefined8 *)((long)&in_RDI[5].cstep + lVar1) = 0;
          *(undefined8 *)((long)&in_RDI[5].refcount + lVar1) = 0;
        }
        local_164 = 0;
      }
    }
    else {
      local_164 = create_pipeline_int8_x86(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90);
    }
  }
  else {
    local_164 = 0;
  }
  return local_164;
}

Assistant:

int ConvolutionDepthWise_x86_avx512::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                weight_data_tm = weight_data;
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                weight_data_tm = weight_data;
            }
            else
            {
                create_group_ops(opt);
            }
        }

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}